

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Byte.cpp
# Opt level: O2

void cplus::lang::Byte::binToString(char value,char *buffer)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 uStack_20;
  undefined1 uStack_1e;
  undefined1 uStack_1c;
  undefined1 uStack_1a;
  
  auVar1._1_3_ = 0;
  auVar1[0] = value;
  auVar1[4] = value;
  auVar1._5_3_ = 0;
  auVar1[8] = value;
  auVar1._9_3_ = 0;
  auVar1[0xc] = value;
  auVar1._13_3_ = 0;
  auVar2 = _DAT_0011fee0 & auVar1;
  auVar3._0_4_ = -(uint)(auVar2._0_4_ == 0);
  auVar3._4_4_ = -(uint)(auVar2._4_4_ == 0);
  auVar3._8_4_ = -(uint)(auVar2._8_4_ == 0);
  auVar3._12_4_ = -(uint)(auVar2._12_4_ == 0);
  auVar2 = packssdw(auVar3,auVar3);
  uStack_1e = auVar2[10];
  uStack_20 = auVar2[8];
  uStack_1a = auVar2[0xe];
  uStack_1c = auVar2[0xc];
  *(ulong *)buffer =
       CONCAT17(uStack_1a + '1',
                CONCAT16(uStack_1c + '1',
                         CONCAT15(uStack_1e + '1',
                                  CONCAT14(uStack_20 + '1',
                                           CONCAT13('1' - (SUB164(auVar1 & _DAT_0011fef0,8) == 0),
                                                    CONCAT12('1' - (SUB164(auVar1 & _DAT_0011fef0,0)
                                                                   == 0),
                                                             CONCAT11('1' - ((value & 0x40U) == 0),
                                                                      '1' - (-1 < value))))))));
  return;
}

Assistant:

void Byte::binToString(char value, char *buffer) {
			buffer[7] = ((value & 0x1) == 0 ? '0' : '1');
			buffer[6] = ((value & 0x2) == 0 ? '0' : '1');
			buffer[5] = ((value & 0x4) == 0 ? '0' : '1');
			buffer[4] = ((value & 0x8) == 0 ? '0' : '1');
			buffer[3] = ((value & 0x10) == 0 ? '0' : '1');
			buffer[2] = ((value & 0x20) == 0 ? '0' : '1');
			buffer[1] = ((value & 0x40) == 0 ? '0' : '1');
			buffer[0] = ((value & 0x80) == 0 ? '0' : '1');
		}